

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O1

void duckdb::CreateSortKeyHelpers::CreateSortKey
               (Vector *input,idx_t input_count,OrderModifiers order_modifier,Vector *result)

{
  tuple<duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_> this;
  initializer_list<duckdb::OrderModifiers> __l;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  sort_key_data;
  vector<duckdb::OrderModifiers,_true> modifiers;
  __uniq_ptr_impl<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
  local_60;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  local_58;
  vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_> local_40;
  
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT62(local_58.
                         super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_6_,order_modifier);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  ::std::vector<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>::vector
            (&local_40,__l,(allocator_type *)&local_60);
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this.
  super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
  .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
        )operator_new(0x78);
  SortKeyVectorData::SortKeyVectorData
            ((SortKeyVectorData *)
             this.
             super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
             .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl,input,
             input_count,order_modifier);
  local_60._M_t.
  super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
  .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl =
       (tuple<duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>)
       (tuple<duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>)
       this.
       super__Tuple_impl<0UL,_duckdb::SortKeyVectorData_*,_std::default_delete<duckdb::SortKeyVectorData>_>
       .super__Head_base<0UL,_duckdb::SortKeyVectorData_*,_false>._M_head_impl;
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>
            ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>,std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,std::default_delete<duckdb::SortKeyVectorData>,true>>>
              *)&local_58,
             (unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
              *)&local_60);
  ::std::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>::
  ~unique_ptr((unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>_>
               *)&local_60);
  CreateSortKeyInternal
            ((vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
              *)&local_58,(vector<duckdb::OrderModifiers,_true> *)&local_40,result,input_count);
  ::std::
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
  ::~vector(&local_58);
  if (local_40.super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.
                    super__Vector_base<duckdb::OrderModifiers,_std::allocator<duckdb::OrderModifiers>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void CreateSortKeyHelpers::CreateSortKey(Vector &input, idx_t input_count, OrderModifiers order_modifier,
                                         Vector &result) {
	// prepare the sort key data
	vector<OrderModifiers> modifiers {order_modifier};
	vector<unique_ptr<SortKeyVectorData>> sort_key_data;
	sort_key_data.push_back(make_uniq<SortKeyVectorData>(input, input_count, order_modifier));

	CreateSortKeyInternal(sort_key_data, modifiers, result, input_count);
}